

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

void __thiscall
Omega_h::Mesh::set_parting(Mesh *this,Omega_h_Parting parting_in,Int nlayers,bool verbose)

{
  I32 IVar1;
  element_type *peVar2;
  ostream *poVar3;
  bool verbose_local;
  Int nlayers_local;
  Omega_h_Parting parting_in_local;
  Mesh *this_local;
  
  if (verbose) {
    peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->comm_);
    IVar1 = Comm::rank(peVar2);
    if (IVar1 == 0) {
      std::operator<<((ostream *)&std::cout,"going to ");
      if (parting_in == OMEGA_H_ELEM_BASED) {
        std::operator<<((ostream *)&std::cout,"element based");
      }
      else if (parting_in == OMEGA_H_GHOSTED) {
        poVar3 = std::operator<<((ostream *)&std::cout,"ghosted (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,nlayers);
        std::operator<<(poVar3," layers)");
      }
      else if (parting_in == OMEGA_H_VERT_BASED) {
        std::operator<<((ostream *)&std::cout,"vertex based");
      }
      std::operator<<((ostream *)&std::cout," partitioning\n");
    }
  }
  if (this->parting_ == -1) {
    this->parting_ = parting_in;
    this->nghost_layers_ = nlayers;
  }
  else if ((this->parting_ != parting_in) || (this->nghost_layers_ != nlayers)) {
    if (parting_in == OMEGA_H_ELEM_BASED) {
      if (nlayers != 0) {
        fail("assertion %s failed at %s +%d\n","nlayers == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,0x200);
      }
      peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->comm_);
      IVar1 = Comm::size(peVar2);
      if (1 < IVar1) {
        partition_by_elems(this,verbose);
      }
    }
    else if (parting_in == OMEGA_H_GHOSTED) {
      if ((this->parting_ != 1) || (nlayers < this->nghost_layers_)) {
        set_parting(this,OMEGA_H_ELEM_BASED,0,false);
      }
      peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->comm_);
      IVar1 = Comm::size(peVar2);
      if (1 < IVar1) {
        ghost_mesh(this,nlayers,verbose);
      }
    }
    else if (parting_in == OMEGA_H_VERT_BASED) {
      if (nlayers != 1) {
        fail("assertion %s failed at %s +%d\n","nlayers == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,0x208);
      }
      peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->comm_);
      IVar1 = Comm::size(peVar2);
      if (1 < IVar1) {
        partition_by_verts(this,verbose);
      }
    }
    this->parting_ = parting_in;
    this->nghost_layers_ = nlayers;
  }
  return;
}

Assistant:

void Mesh::set_parting(Omega_h_Parting parting_in, Int nlayers, bool verbose) {
  if (verbose && comm_->rank() == 0) {
    std::cout << "going to ";
    switch (parting_in) {
      case OMEGA_H_ELEM_BASED:
        std::cout << "element based";
        break;
      case OMEGA_H_VERT_BASED:
        std::cout << "vertex based";
        break;
      case OMEGA_H_GHOSTED:
        std::cout << "ghosted (" << nlayers << " layers)";
        break;
    }
    std::cout << " partitioning\n";
  }
  if (parting_ == -1) {
    parting_ = parting_in;
    nghost_layers_ = nlayers;
    return;
  }
  if (parting_ == parting_in && nghost_layers_ == nlayers) {
    return;
  }
  if (parting_in == OMEGA_H_ELEM_BASED) {
    OMEGA_H_CHECK(nlayers == 0);
    if (comm_->size() > 1) partition_by_elems(this, verbose);
  } else if (parting_in == OMEGA_H_GHOSTED) {
    if (parting_ != OMEGA_H_GHOSTED || nlayers < nghost_layers_) {
      set_parting(OMEGA_H_ELEM_BASED, 0, false);
    }
    if (comm_->size() > 1) ghost_mesh(this, nlayers, verbose);
  } else if (parting_in == OMEGA_H_VERT_BASED) {
    OMEGA_H_CHECK(nlayers == 1);
    if (comm_->size() > 1) partition_by_verts(this, verbose);
  }
  parting_ = parting_in;
  nghost_layers_ = nlayers;
}